

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O3

void __thiscall JetHead::CircularBuffer::CircularBuffer(CircularBuffer *this,int buf_size)

{
  uint8_t *puVar1;
  
  Mutex::Mutex(&this->mLock,true);
  Condition::Condition(&this->mDataCondition);
  Condition::Condition(&this->mFreeCondition);
  this->mFreeBuffer = true;
  puVar1 = (uint8_t *)
           operator_new__((long)buf_size,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/CircularBuffer.cpp"
                          ,0x38);
  this->mBuffer = puVar1;
  this->mReadPtr = puVar1;
  this->mWritePtr = puVar1;
  this->mBufferSize = buf_size;
  this->mEnd = puVar1 + buf_size;
  this->mLen = 0;
  return;
}

Assistant:

CircularBuffer::CircularBuffer( int buf_size )
	: mLock( true ), mFreeBuffer( true )
{
	mBuffer = jh_new uint8_t[ buf_size ];
	mReadPtr = mBuffer;
	mWritePtr = mBuffer;
	mBufferSize = buf_size;
	mEnd = mBuffer + buf_size;
	mLen = 0;
}